

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLayerNormalizationWrongGammaOrBeta(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  WeightParams *pWVar6;
  string *psVar7;
  long lVar8;
  ostream *poVar9;
  undefined1 local_130 [8];
  Result res4;
  Result res3;
  Result res2;
  undefined1 local_b0 [8];
  Result res1;
  LayerNormalizationLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  res1.m_message.field_2._8_8_ =
       CoreML::Specification::NeuralNetworkLayer::mutable_layernormalization(this_00);
  CoreML::Specification::LayerNormalizationLayerParams::add_normalizedshape
            ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_,1);
  pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                     ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
  pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                     ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
  pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                     ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
  CoreML::Specification::WeightParams::mutable_quantization(pWVar6);
  CoreML::validate<(MLModelType)500>((Result *)local_b0,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1711);
    poVar9 = std::operator<<(poVar9,": error: ");
    poVar9 = std::operator<<(poVar9,"!((res1).good())");
    poVar9 = std::operator<<(poVar9," was false, expected true.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_b0);
    lVar8 = std::__cxx11::string::find((char *)psVar7,0x4c1ecf);
    if (lVar8 == -1) {
      poVar9 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1712);
      poVar9 = std::operator<<(poVar9,": error: ");
      poVar9 = std::operator<<(poVar9,"res1.message().find(\"quantized\") != std::string::npos");
      poVar9 = std::operator<<(poVar9," was false, expected true.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                         ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
      CoreML::Specification::WeightParams::clear_floatvalue(pWVar6);
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                         ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
      CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                         ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
      CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
      pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                         ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
      CoreML::Specification::WeightParams::mutable_quantization(pWVar6);
      CoreML::validate<(MLModelType)500>((Result *)((long)&res3.m_message.field_2 + 8),(Model *)&in)
      ;
      bVar1 = CoreML::Result::good((Result *)((long)&res3.m_message.field_2 + 8));
      if (bVar1) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x171a);
        poVar9 = std::operator<<(poVar9,": error: ");
        poVar9 = std::operator<<(poVar9,"!((res2).good())");
        poVar9 = std::operator<<(poVar9," was false, expected true.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
      else {
        psVar7 = CoreML::Result::message_abi_cxx11_((Result *)((long)&res3.m_message.field_2 + 8));
        lVar8 = std::__cxx11::string::find((char *)psVar7,0x4c1ecf);
        if (lVar8 == -1) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar9 = std::operator<<(poVar9,":");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x171b);
          poVar9 = std::operator<<(poVar9,": error: ");
          poVar9 = std::operator<<(poVar9,"res2.message().find(\"quantized\") != std::string::npos")
          ;
          poVar9 = std::operator<<(poVar9," was false, expected true.");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          m._oneof_case_[0] = 1;
        }
        else {
          pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                             ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
          CoreML::Specification::WeightParams::clear_quantization(pWVar6);
          pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                             ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
          CoreML::Specification::WeightParams::clear_quantization(pWVar6);
          pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                             ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
          CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
          CoreML::validate<(MLModelType)500>
                    ((Result *)((long)&res4.m_message.field_2 + 8),(Model *)&in);
          bVar1 = CoreML::Result::good((Result *)((long)&res4.m_message.field_2 + 8));
          if (bVar1) {
            poVar9 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar9 = std::operator<<(poVar9,":");
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1724);
            poVar9 = std::operator<<(poVar9,": error: ");
            poVar9 = std::operator<<(poVar9,"!((res3).good())");
            poVar9 = std::operator<<(poVar9," was false, expected true.");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            m._oneof_case_[0] = 1;
          }
          else {
            psVar7 = CoreML::Result::message_abi_cxx11_
                               ((Result *)((long)&res4.m_message.field_2 + 8));
            lVar8 = std::__cxx11::string::find((char *)psVar7,0x4c1f45);
            if (lVar8 == -1) {
              poVar9 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar9 = std::operator<<(poVar9,":");
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x1725);
              poVar9 = std::operator<<(poVar9,": error: ");
              poVar9 = std::operator<<(poVar9,
                                       "res3.message().find(\"Shape of gamma\") != std::string::npos"
                                      );
              poVar9 = std::operator<<(poVar9," was false, expected true.");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              m._oneof_case_[0] = 1;
            }
            else {
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                                 ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
              CoreML::Specification::WeightParams::clear_floatvalue(pWVar6);
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                                 ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
              CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                                 ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
              CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
              pWVar6 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                                 ((LayerNormalizationLayerParams *)res1.m_message.field_2._8_8_);
              CoreML::Specification::WeightParams::add_floatvalue(pWVar6,1.0);
              CoreML::validate<(MLModelType)500>((Result *)local_130,(Model *)&in);
              bVar1 = CoreML::Result::good((Result *)local_130);
              if (bVar1) {
                poVar9 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar9 = std::operator<<(poVar9,":");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x172d);
                poVar9 = std::operator<<(poVar9,": error: ");
                poVar9 = std::operator<<(poVar9,"!((res4).good())");
                poVar9 = std::operator<<(poVar9," was false, expected true.");
                std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                m._oneof_case_[0] = 1;
              }
              else {
                psVar7 = CoreML::Result::message_abi_cxx11_((Result *)local_130);
                lVar8 = std::__cxx11::string::find((char *)psVar7,0x4c1f8f);
                if (lVar8 == -1) {
                  poVar9 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                          );
                  poVar9 = std::operator<<(poVar9,":");
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,0x172e);
                  poVar9 = std::operator<<(poVar9,": error: ");
                  poVar9 = std::operator<<(poVar9,
                                           "res4.message().find(\"Shape of beta\") != std::string::npos"
                                          );
                  poVar9 = std::operator<<(poVar9," was false, expected true.");
                  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                  m._oneof_case_[0] = 1;
                }
                else {
                  m._oneof_case_[0] = 0;
                }
              }
              CoreML::Result::~Result((Result *)local_130);
            }
          }
          CoreML::Result::~Result((Result *)((long)&res4.m_message.field_2 + 8));
        }
      }
      CoreML::Result::~Result((Result *)((long)&res3.m_message.field_2 + 8));
    }
  }
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLayerNormalizationWrongGammaOrBeta() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->add_normalizedshape(1);

    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_gamma()->mutable_quantization();

    // value of gamma and beta should be unquantized
    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("quantized") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->mutable_quantization();

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("quantized") != std::string::npos);

    // shape of gamma and beta should be match normalized shape

    params->mutable_gamma()->clear_quantization();
    params->mutable_beta()->clear_quantization();
    params->mutable_gamma()->add_floatvalue(1.0);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Shape of gamma") != std::string::npos);

    params->mutable_gamma()->clear_floatvalue();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(1.0);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Shape of beta") != std::string::npos);

    return 0;
}